

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O0

int Ndr_TypeNdr2Wlc(int Type)

{
  undefined4 local_c;
  int Type_local;
  
  if (Type == 0x61) {
    local_c = 6;
  }
  else if (Type == 0xb) {
    local_c = 7;
  }
  else if (Type == 0x15) {
    local_c = 8;
  }
  else if (Type == 0x45) {
    local_c = 9;
  }
  else if (Type == 0x47) {
    local_c = 10;
  }
  else if (Type == 0x44) {
    local_c = 0xb;
  }
  else if (Type == 0x46) {
    local_c = 0xc;
  }
  else if (Type == 0x49) {
    local_c = 0xd;
  }
  else if (Type == 0x48) {
    local_c = 0xe;
  }
  else if (Type == 0xc) {
    local_c = 0xf;
  }
  else if (Type == 0xd) {
    local_c = 0x10;
  }
  else if (Type == 0xf) {
    local_c = 0x11;
  }
  else if (Type == 0x11) {
    local_c = 0x12;
  }
  else if (Type == 0xe) {
    local_c = 0x13;
  }
  else if (Type == 0x10) {
    local_c = 0x14;
  }
  else if (Type == 0x12) {
    local_c = 0x15;
  }
  else if (Type == 0x5b) {
    local_c = 0x16;
  }
  else if (Type == 0x5c) {
    local_c = 0x17;
  }
  else if (Type == 0x5d) {
    local_c = 0x18;
  }
  else if (Type == 0x5e) {
    local_c = 0x19;
  }
  else if (Type == 0x24) {
    local_c = 0x1a;
  }
  else if (Type == 0x5f) {
    local_c = 0x1b;
  }
  else if (Type == 0x25) {
    local_c = 0x1c;
  }
  else if (Type == 0x27) {
    local_c = 0x1d;
  }
  else if (Type == 0x29) {
    local_c = 0x1e;
  }
  else if (Type == 0x2b) {
    local_c = 8;
  }
  else if (Type == 0x2c) {
    local_c = 0x39;
  }
  else if (Type == 0x30) {
    local_c = 0x3a;
  }
  else if (Type == 0x42) {
    local_c = 0x1f;
  }
  else if (Type == 0x43) {
    local_c = 0x20;
  }
  else if (Type == 0x3e) {
    local_c = 0x21;
  }
  else if (Type == 0x41) {
    local_c = 0x22;
  }
  else if (Type == 0x3f) {
    local_c = 0x23;
  }
  else if (Type == 0x40) {
    local_c = 0x24;
  }
  else if (Type == 0x1e) {
    local_c = 0x25;
  }
  else if (Type == 0x20) {
    local_c = 0x26;
  }
  else if (Type == 0x22) {
    local_c = 0x27;
  }
  else if (Type == 0x1f) {
    local_c = 0x28;
  }
  else if (Type == 0x21) {
    local_c = 0x29;
  }
  else if (Type == 0x23) {
    local_c = 0x2a;
  }
  else if (Type == 0x32) {
    local_c = 0x2b;
  }
  else if (Type == 0x33) {
    local_c = 0x2c;
  }
  else if (Type == 0x34) {
    local_c = 0x2d;
  }
  else if (Type == 0x36) {
    local_c = 0x2e;
  }
  else if (Type == 0x38) {
    local_c = 0x2f;
  }
  else if (Type == 0x37) {
    local_c = 0x30;
  }
  else if (Type == 0x39) {
    local_c = 0x31;
  }
  else if (Type == 0x3a) {
    local_c = 0x32;
  }
  else if (Type == 0x3b) {
    local_c = 0x33;
  }
  else if (Type == 0x60) {
    local_c = 0x34;
  }
  else if (Type == 0x62) {
    local_c = 0x38;
  }
  else if (Type == 0x35) {
    local_c = 0x2d;
  }
  else if (Type == 0x58) {
    local_c = 3;
  }
  else if (Type == 0x59) {
    local_c = 5;
  }
  else if (Type == 0x50) {
    local_c = 0x36;
  }
  else if (Type == 0x51) {
    local_c = 0x37;
  }
  else if (Type == 0x4b) {
    local_c = 0x3b;
  }
  else {
    local_c = -1;
  }
  return local_c;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Ndr_TypeNdr2Wlc( int Type )
{
    if ( Type == ABC_OPER_CONST )         return WLC_OBJ_CONST;         // 06: constant
    if ( Type == ABC_OPER_BIT_BUF )       return WLC_OBJ_BUF;           // 07: buffer
    if ( Type == ABC_OPER_BIT_MUX )       return WLC_OBJ_MUX;           // 08: multiplexer
    if ( Type == ABC_OPER_SHIFT_R )       return WLC_OBJ_SHIFT_R;       // 09: shift right
    if ( Type == ABC_OPER_SHIFT_RA )      return WLC_OBJ_SHIFT_RA;      // 10: shift right (arithmetic)
    if ( Type == ABC_OPER_SHIFT_L )       return WLC_OBJ_SHIFT_L;       // 11: shift left
    if ( Type == ABC_OPER_SHIFT_LA )      return WLC_OBJ_SHIFT_LA;      // 12: shift left (arithmetic)
    if ( Type == ABC_OPER_SHIFT_ROTR )    return WLC_OBJ_ROTATE_R;      // 13: rotate right
    if ( Type == ABC_OPER_SHIFT_ROTL )    return WLC_OBJ_ROTATE_L;      // 14: rotate left
    if ( Type == ABC_OPER_BIT_INV )       return WLC_OBJ_BIT_NOT;       // 15: bitwise NOT
    if ( Type == ABC_OPER_BIT_AND )       return WLC_OBJ_BIT_AND;       // 16: bitwise AND
    if ( Type == ABC_OPER_BIT_OR )        return WLC_OBJ_BIT_OR;        // 17: bitwise OR
    if ( Type == ABC_OPER_BIT_XOR )       return WLC_OBJ_BIT_XOR;       // 18: bitwise XOR
    if ( Type == ABC_OPER_BIT_NAND )      return WLC_OBJ_BIT_NAND;      // 19: bitwise AND
    if ( Type == ABC_OPER_BIT_NOR )       return WLC_OBJ_BIT_NOR;       // 20: bitwise OR
    if ( Type == ABC_OPER_BIT_NXOR )      return WLC_OBJ_BIT_NXOR;      // 21: bitwise NXOR
    if ( Type == ABC_OPER_SLICE )         return WLC_OBJ_BIT_SELECT;    // 22: bit selection
    if ( Type == ABC_OPER_CONCAT )        return WLC_OBJ_BIT_CONCAT;    // 23: bit concatenation
    if ( Type == ABC_OPER_ZEROPAD )       return WLC_OBJ_BIT_ZEROPAD;   // 24: zero padding
    if ( Type == ABC_OPER_SIGNEXT )       return WLC_OBJ_BIT_SIGNEXT;   // 25: sign extension
    if ( Type == ABC_OPER_LOGIC_NOT )     return WLC_OBJ_LOGIC_NOT;     // 26: logic NOT
    if ( Type == ABC_OPER_LOGIC_IMPL )    return WLC_OBJ_LOGIC_IMPL;    // 27: logic implication
    if ( Type == ABC_OPER_LOGIC_AND )     return WLC_OBJ_LOGIC_AND;     // 28: logic AND
    if ( Type == ABC_OPER_LOGIC_OR )      return WLC_OBJ_LOGIC_OR;      // 29: logic OR
    if ( Type == ABC_OPER_LOGIC_XOR )     return WLC_OBJ_LOGIC_XOR;     // 30: logic XOR
    if ( Type == ABC_OPER_SEL_NMUX )      return WLC_OBJ_MUX;           // 08: multiplexer
    if ( Type == ABC_OPER_SEL_SEL )       return WLC_OBJ_SEL;           // 57: selector
    if ( Type == ABC_OPER_SEL_DEC )       return WLC_OBJ_DEC;           // 58: decoder
    if ( Type == ABC_OPER_COMP_EQU )      return WLC_OBJ_COMP_EQU;      // 31: compare equal
    if ( Type == ABC_OPER_COMP_NOTEQU )   return WLC_OBJ_COMP_NOTEQU;   // 32: compare not equal
    if ( Type == ABC_OPER_COMP_LESS )     return WLC_OBJ_COMP_LESS;     // 33: compare less
    if ( Type == ABC_OPER_COMP_MORE )     return WLC_OBJ_COMP_MORE;     // 34: compare more
    if ( Type == ABC_OPER_COMP_LESSEQU )  return WLC_OBJ_COMP_LESSEQU;  // 35: compare less or equal
    if ( Type == ABC_OPER_COMP_MOREEQU )  return WLC_OBJ_COMP_MOREEQU;  // 36: compare more or equal
    if ( Type == ABC_OPER_RED_AND )       return WLC_OBJ_REDUCT_AND;    // 37: reduction AND
    if ( Type == ABC_OPER_RED_OR )        return WLC_OBJ_REDUCT_OR;     // 38: reduction OR
    if ( Type == ABC_OPER_RED_XOR )       return WLC_OBJ_REDUCT_XOR;    // 39: reduction XOR
    if ( Type == ABC_OPER_RED_NAND )      return WLC_OBJ_REDUCT_NAND;   // 40: reduction NAND
    if ( Type == ABC_OPER_RED_NOR )       return WLC_OBJ_REDUCT_NOR;    // 41: reduction NOR
    if ( Type == ABC_OPER_RED_NXOR )      return WLC_OBJ_REDUCT_NXOR;   // 42: reduction NXOR
    if ( Type == ABC_OPER_ARI_ADD )       return WLC_OBJ_ARI_ADD;       // 43: arithmetic addition
    if ( Type == ABC_OPER_ARI_SUB )       return WLC_OBJ_ARI_SUB;       // 44: arithmetic subtraction
    if ( Type == ABC_OPER_ARI_MUL )       return WLC_OBJ_ARI_MULTI;     // 45: arithmetic multiplier
    if ( Type == ABC_OPER_ARI_DIV )       return WLC_OBJ_ARI_DIVIDE;    // 46: arithmetic division
    if ( Type == ABC_OPER_ARI_REM )       return WLC_OBJ_ARI_REM;       // 47: arithmetic remainder
    if ( Type == ABC_OPER_ARI_MOD )       return WLC_OBJ_ARI_MODULUS;   // 48: arithmetic modulus
    if ( Type == ABC_OPER_ARI_POW )       return WLC_OBJ_ARI_POWER;     // 49: arithmetic power
    if ( Type == ABC_OPER_ARI_MIN )       return WLC_OBJ_ARI_MINUS;     // 50: arithmetic minus
    if ( Type == ABC_OPER_ARI_SQRT )      return WLC_OBJ_ARI_SQRT;      // 51: integer square root
    if ( Type == ABC_OPER_ARI_SQUARE )    return WLC_OBJ_ARI_SQUARE;    // 52: integer square
    if ( Type == ABC_OPER_ARI_ADDSUB )    return WLC_OBJ_ARI_ADDSUB;    // 56: adder-subtractor
    if ( Type == ABC_OPER_ARI_SMUL )      return WLC_OBJ_ARI_MULTI;     // 45: signed multiplier
    if ( Type == ABC_OPER_DFF )           return WLC_OBJ_FO;            // 03: flop
    if ( Type == ABC_OPER_DFFRSE )        return WLC_OBJ_FF;            // 05: flop
    if ( Type == ABC_OPER_RAMR )          return WLC_OBJ_READ;          // 54: read port
    if ( Type == ABC_OPER_RAMW )          return WLC_OBJ_WRITE;         // 55: write port
    if ( Type == ABC_OPER_LUT )           return WLC_OBJ_LUT;           // 59: LUT
    return -1;
}